

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapOrSetDataList.h
# Opt level: O3

void __thiscall
Js::MapOrSetDataList<void_*>::Remove(MapOrSetDataList<void_*> *this,MapOrSetDataNode<void_*> *node)

{
  MapOrSetDataNode<void_*> *pMVar1;
  code *pcVar2;
  Type TVar3;
  Type TVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *addr;
  Type local_40;
  Type next;
  Type prev;
  
  pMVar1 = (node->next).ptr;
  Memory::Recycler::WBSetBit((char *)&local_40);
  local_40.ptr = pMVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
  pMVar1 = (node->prev).ptr;
  Memory::Recycler::WBSetBit((char *)&next);
  next.ptr = pMVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&next);
  TVar4.ptr = next.ptr;
  TVar3.ptr = local_40.ptr;
  if (local_40.ptr == (MapOrSetDataNode<void_*> *)0x0) {
    if ((this->last).ptr != node) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                  ,0xb2,"(last == node)","last == node");
      if (!bVar5) goto LAB_00d0fe8a;
      *puVar6 = 0;
    }
    TVar3.ptr = next.ptr;
    addr = &this->last;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = TVar3.ptr;
  }
  else {
    addr = &(local_40.ptr)->prev;
    Memory::Recycler::WBSetBit((char *)addr);
    ((TVar3.ptr)->prev).ptr = TVar4.ptr;
  }
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  TVar4 = next;
  TVar3.ptr = local_40.ptr;
  if (next.ptr == (MapOrSetDataNode<void_*> *)0x0) {
    if ((this->first).ptr != node) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                  ,0xbc,"(first == node)","first == node");
      if (!bVar5) {
LAB_00d0fe8a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    TVar3.ptr = local_40.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->first).ptr = TVar3.ptr;
  }
  else {
    Memory::Recycler::WBSetBit((char *)next.ptr);
    ((TVar4.ptr)->next).ptr = TVar3.ptr;
    this = (MapOrSetDataList<void_*> *)TVar4;
  }
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  return;
}

Assistant:

void Remove(MapOrSetDataNode<TData>* node)
        {
            // Cannot delete the node itself, nor change its next and prev pointers!
            // Otherwise active iterators may break. Iterators depend on nodes existing
            // until garbage collector picks them up.
            auto next = node->next;
            auto prev = node->prev;

            if (next)
            {
                next->prev = prev;
            }
            else
            {
                Assert(last == node);
                last = prev;
            }

            if (prev)
            {
                prev->next = next;
            }
            else
            {
                Assert(first == node);
                first = next;
            }
        }